

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hh
# Opt level: O0

void __thiscall SatLookAngles::SatLookAngles(SatLookAngles *this,double lat,double lon,double alt)

{
  DateTime DVar1;
  double alt_local;
  double lon_local;
  double lat_local;
  SatLookAngles *this_local;
  
  std::vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
  ::vector(&this->_sats);
  Observer::Observer(&this->_me,lat,lon,alt);
  DVar1 = DateTime::Now(true);
  (this->_time).m_encoded = DVar1.m_encoded;
  return;
}

Assistant:

SatLookAngles(double lat, double lon, double alt)
      : _me(lat, lon, alt), _time(DateTime::Now(true)) {}